

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O1

void __thiscall xray_re::xr_bone::calculate_bind(xr_bone *this,fmatrix *parent_xform)

{
  fmatrix *this_00;
  pointer ppxVar1;
  pointer ppxVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  anon_union_64_4_b9f67276_for__matrix<float>_1 local_58;
  
  this_00 = &this->m_bind_xform;
  fVar3 = -(this->m_bind_rotate).field_0.field_0.y;
  fVar8 = -(this->m_bind_rotate).field_0.field_0.x;
  fVar7 = -(this->m_bind_rotate).field_0.field_0.z;
  fVar4 = sinf(fVar3);
  fVar3 = cosf(fVar3);
  fVar5 = sinf(fVar8);
  fVar8 = cosf(fVar8);
  fVar6 = sinf(fVar7);
  fVar7 = cosf(fVar7);
  (this->m_bind_xform).field_0.field_0._11 = fVar3 * fVar7 - fVar6 * fVar4 * fVar5;
  (this->m_bind_xform).field_0.field_0._12 = fVar6 * -fVar8;
  (this->m_bind_xform).field_0.field_0._13 = fVar3 * fVar6 * fVar5 + fVar4 * fVar7;
  (this->m_bind_xform).field_0.field_0._14 = 0.0;
  (this->m_bind_xform).field_0.field_0._21 = fVar4 * fVar5 * fVar7 + fVar3 * fVar6;
  (this->m_bind_xform).field_0.field_0._22 = fVar8 * fVar7;
  (this->m_bind_xform).field_0.field_0._23 = fVar6 * fVar4 - fVar3 * fVar5 * fVar7;
  (this->m_bind_xform).field_0.field_0._24 = 0.0;
  (this->m_bind_xform).field_0.field_0._31 = -fVar8 * fVar4;
  (this->m_bind_xform).field_0.field_0._32 = fVar5;
  (this->m_bind_xform).field_0.field_0._33 = fVar3 * fVar8;
  *(undefined8 *)((long)&(this->m_bind_xform).field_0 + 0x2c) = 0;
  *(undefined8 *)((long)&(this->m_bind_xform).field_0 + 0x34) = 0;
  (this->m_bind_xform).field_0.field_0._44 = 1.0;
  (this->m_bind_xform).field_0.field_0._41 = (this->m_bind_offset).field_0.field_0.x;
  *(undefined8 *)((long)&(this->m_bind_xform).field_0 + 0x34) =
       *(undefined8 *)((long)&(this->m_bind_offset).field_0 + 4);
  local_58._0_8_ = *(undefined8 *)&(this->m_bind_xform).field_0;
  local_58._8_8_ = *(undefined8 *)((long)&(this->m_bind_xform).field_0 + 8);
  local_58._16_8_ = *(undefined8 *)((long)&(this->m_bind_xform).field_0 + 0x10);
  local_58.field_0._23 = (this->m_bind_xform).field_0.field_0._23;
  local_58.field_0._24 = (this->m_bind_xform).field_0.field_0._24;
  local_58._32_8_ = *(undefined8 *)((long)&(this->m_bind_xform).field_0 + 0x20);
  local_58._40_8_ = *(undefined8 *)((long)&(this->m_bind_xform).field_0 + 0x28);
  local_58.field_0._41 = (this->m_bind_xform).field_0.field_0._41;
  local_58._52_8_ = *(undefined8 *)((long)&(this->m_bind_xform).field_0 + 0x34);
  local_58.field_0._44 = (this->m_bind_xform).field_0.field_0._44;
  _matrix<float>::mul_43(this_00,parent_xform,(_matrix<float> *)&local_58.field_0);
  _matrix<float>::invert_43(&this->m_bind_i_xform,this_00);
  ppxVar1 = (this->m_children).
            super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppxVar2 = (this->m_children).
                 super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppxVar2 != ppxVar1; ppxVar2 = ppxVar2 + 1) {
    calculate_bind(*ppxVar2,this_00);
  }
  return;
}

Assistant:

void xr_bone::calculate_bind(const fmatrix& parent_xform)
{
	m_bind_xform.set_xyz_i(m_bind_rotate);
	m_bind_xform.c.set(m_bind_offset);
	m_bind_xform.mul_a_43(parent_xform);
	m_bind_i_xform.invert_43(m_bind_xform);

	for (xr_bone_vec_it it = m_children.begin(), end = m_children.end(); it != end; ++it)
		(*it)->calculate_bind(m_bind_xform);
}